

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

bool ImGui_ImplOpenGL3_CreateFontsTexture(void)

{
  ImGuiIO *pIVar1;
  uchar *pixels;
  GLint last_texture;
  int height;
  int width;
  
  pIVar1 = ImGui::GetIO();
  ImFontAtlas::GetTexDataAsRGBA32(pIVar1->Fonts,&pixels,&width,&height,(int *)0x0);
  (*glad_debug_glGetIntegerv)(0x8069,&last_texture);
  (*glad_debug_glGenTextures)(1,&g_FontTexture);
  (*glad_debug_glBindTexture)(0xde1,g_FontTexture);
  (*glad_debug_glTexParameteri)(0xde1,0x2801,0x2601);
  (*glad_debug_glTexParameteri)(0xde1,0x2800,0x2601);
  (*glad_debug_glPixelStorei)(0xcf2,0);
  (*glad_debug_glTexImage2D)(0xde1,0,0x1908,width,height,0,0x1908,0x1401,pixels);
  pIVar1->Fonts->TexID = (ImTextureID)(ulong)g_FontTexture;
  (*glad_debug_glBindTexture)(0xde1,last_texture);
  return true;
}

Assistant:

bool ImGui_ImplOpenGL3_CreateFontsTexture()
{
    // Build texture atlas
    ImGuiIO& io = ImGui::GetIO();
    unsigned char* pixels;
    int width, height;
    io.Fonts->GetTexDataAsRGBA32(&pixels, &width, &height);   // Load as RGBA 32-bit (75% of the memory is wasted, but default font is so small) because it is more likely to be compatible with user's existing shaders. If your ImTextureId represent a higher-level concept than just a GL texture id, consider calling GetTexDataAsAlpha8() instead to save on GPU memory.

    // Upload texture to graphics system
    GLint last_texture;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    glGenTextures(1, &g_FontTexture);
    glBindTexture(GL_TEXTURE_2D, g_FontTexture);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
#ifdef GL_UNPACK_ROW_LENGTH
    glPixelStorei(GL_UNPACK_ROW_LENGTH, 0);
#endif
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, pixels);

    // Store our identifier
    io.Fonts->SetTexID((ImTextureID)(intptr_t)g_FontTexture);

    // Restore state
    glBindTexture(GL_TEXTURE_2D, last_texture);

    return true;
}